

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool *pbVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  char **ppcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  char **local_90;
  anon_union_16_2_67f50693_for_value local_78;
  ulong local_68;
  ValidityMask *local_60;
  bool *local_58;
  anon_union_16_2_67f50693_for_value local_50;
  string_t *local_40;
  bool *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar4 = *(undefined8 *)&ldata->value;
      pcVar5 = (ldata->value).pointer.ptr;
      local_90 = &(rdata->value).pointer.ptr;
      iVar10 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_90 + -1);
        local_50._0_4_ = paVar1->length;
        local_50._4_1_ = paVar1->prefix[0];
        local_50._5_1_ = paVar1->prefix[1];
        local_50._6_1_ = paVar1->prefix[2];
        local_50._7_1_ = paVar1->prefix[3];
        local_50.pointer.ptr = *local_90;
        local_78._0_8_ = uVar4;
        local_78.pointer.ptr = pcVar5;
        bVar7 = string_t::operator==((string_t *)&local_78.pointer,(string_t *)&local_50.pointer);
        result_data[iVar10] = bVar7;
        iVar10 = iVar10 + 1;
        local_90 = local_90 + 2;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = count + 0x3f >> 6;
    uVar9 = 0;
    uVar15 = 0;
    local_68 = uVar8;
    local_60 = mask;
    local_58 = result_data;
    local_40 = ldata;
    do {
      pbVar6 = local_58;
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar13 = count;
        }
LAB_01365924:
        uVar14 = uVar15;
        if (uVar15 < uVar13) {
          uVar4 = *(undefined8 *)&ldata->value;
          pcVar5 = (ldata->value).pointer.ptr;
          ppcVar12 = &rdata[uVar15].value.pointer.ptr;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar12 + -1);
            local_50._0_4_ = paVar1->length;
            local_50._4_1_ = paVar1->prefix[0];
            local_50._5_1_ = paVar1->prefix[1];
            local_50._6_1_ = paVar1->prefix[2];
            local_50._7_1_ = paVar1->prefix[3];
            local_50.pointer.ptr = *ppcVar12;
            local_78._0_8_ = uVar4;
            local_78.pointer.ptr = pcVar5;
            bVar7 = string_t::operator==
                              ((string_t *)&local_78.pointer,(string_t *)&local_50.pointer);
            pbVar6[uVar15] = bVar7;
            uVar15 = uVar15 + 1;
            ppcVar12 = ppcVar12 + 2;
            uVar8 = local_68;
            ldata = local_40;
            mask = local_60;
            uVar14 = uVar13;
          } while (uVar13 != uVar15);
        }
      }
      else {
        uVar3 = puVar2[uVar9];
        uVar13 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar13 = count;
        }
        uVar14 = uVar13;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01365924;
          uVar14 = uVar15;
          if (uVar15 < uVar13) {
            local_38 = local_58 + uVar15;
            ppcVar12 = &rdata[uVar15].value.pointer.ptr;
            uVar11 = 0;
            do {
              if ((uVar3 >> (uVar11 & 0x3f) & 1) != 0) {
                local_78._0_8_ = *(undefined8 *)&ldata->value;
                local_78.pointer.ptr = (ldata->value).pointer.ptr;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar12 + -1);
                local_50._0_4_ = paVar1->length;
                local_50._4_1_ = paVar1->prefix[0];
                local_50._5_1_ = paVar1->prefix[1];
                local_50._6_1_ = paVar1->prefix[2];
                local_50._7_1_ = paVar1->prefix[3];
                local_50.pointer.ptr = *ppcVar12;
                bVar7 = string_t::operator==
                                  ((string_t *)&local_78.pointer,(string_t *)&local_50.pointer);
                local_38[uVar11] = bVar7;
              }
              uVar11 = uVar11 + 1;
              ppcVar12 = ppcVar12 + 2;
              uVar8 = local_68;
              mask = local_60;
              uVar14 = uVar13;
            } while (uVar13 - uVar15 != uVar11);
          }
        }
      }
      uVar9 = uVar9 + 1;
      uVar15 = uVar14;
    } while (uVar9 != uVar8);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}